

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

bool __thiscall ElfFile::load(ElfFile *this,ByteArray *data,bool sort)

{
  Elf32_Phdr header;
  Elf32_Shdr header_00;
  int iVar1;
  bool bVar2;
  Elf32_Word EVar3;
  Elf32_Off EVar4;
  ElfSegment *this_00;
  ElfSection *this_01;
  size_type sVar5;
  reference ppEVar6;
  iterator __first;
  iterator __last;
  int local_154;
  int i_2;
  undefined1 local_140 [8];
  ByteArray data_1;
  value_type pEStack_120;
  int k;
  ElfSegment *owner;
  ElfSection *local_e8;
  ElfSection *section;
  Elf32_Shdr sectionHeader_1;
  size_t pos_1;
  int i_1;
  ElfSegment *local_70;
  ElfSegment *segment;
  ByteArray segmentData;
  Elf32_Phdr sectionHeader;
  size_t pos;
  size_t i;
  bool sort_local;
  ByteArray *data_local;
  ElfFile *this_local;
  
  ByteArray::operator=(&this->fileData,data);
  loadElfHeader(this);
  this->symTab = (ElfSection *)0x0;
  this->strTab = (ElfSection *)0x0;
  for (pos = 0; pos < (this->fileHeader).e_phnum; pos = pos + 1) {
    loadProgramHeader(this,(Elf32_Phdr *)&segmentData.allocatedSize_,&this->fileData,
                      (ulong)(this->fileHeader).e_phoff + pos * (this->fileHeader).e_phentsize);
    ByteArray::mid((ByteArray *)&segment,&this->fileData,(ulong)segmentData.allocatedSize_._4_4_,
                   (ulong)sectionHeader.p_vaddr);
    this_00 = (ElfSegment *)operator_new(0x58);
    header.p_offset = segmentData.allocatedSize_._4_4_;
    header.p_type = (undefined4)segmentData.allocatedSize_;
    header.p_memsz = sectionHeader.p_paddr;
    header.p_filesz = sectionHeader.p_vaddr;
    header._8_8_ = sectionHeader._0_8_;
    header._24_8_ = sectionHeader._16_8_;
    ElfSegment::ElfSegment(this_00,header,(ByteArray *)&segment);
    local_70 = this_00;
    std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::push_back(&this->segments,&local_70);
    ByteArray::~ByteArray((ByteArray *)&segment);
  }
  pos_1._4_4_ = 0;
  do {
    if ((int)(uint)(this->fileHeader).e_shnum <= (int)pos_1._4_4_) {
      determinePartOrder(this);
      loadSectionNames(this);
      if (sort) {
        __first = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::begin
                            (&this->segmentlessSections);
        __last = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::end
                           (&this->segmentlessSections);
        std::
        sort<__gnu_cxx::__normal_iterator<ElfSection**,std::vector<ElfSection*,std::allocator<ElfSection*>>>,bool(*)(ElfSection*,ElfSection*)>
                  ((__normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_>
                    )__first._M_current,
                   (__normal_iterator<ElfSection_**,_std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>_>
                    )__last._M_current,compareSection);
        for (local_154 = 0;
            sVar5 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::size(&this->segments),
            local_154 < (int)sVar5; local_154 = local_154 + 1) {
          ppEVar6 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::operator[]
                              (&this->segments,(long)local_154);
          ElfSegment::sortSections(*ppEVar6);
        }
      }
      return true;
    }
    sectionHeader_1._32_8_ =
         ZEXT48((this->fileHeader).e_shoff + pos_1._4_4_ * (this->fileHeader).e_shentsize);
    loadSectionHeader(this,(Elf32_Shdr *)&section,&this->fileData,sectionHeader_1._32_8_);
    this_01 = (ElfSection *)operator_new(0x68);
    header_00.sh_flags = sectionHeader_1.sh_name;
    header_00.sh_addr = sectionHeader_1.sh_type;
    header_00._0_8_ = section;
    header_00.sh_offset = sectionHeader_1.sh_flags;
    header_00.sh_size = sectionHeader_1.sh_addr;
    header_00.sh_link = sectionHeader_1.sh_offset;
    header_00.sh_info = sectionHeader_1.sh_size;
    header_00.sh_addralign = sectionHeader_1.sh_link;
    header_00.sh_entsize = sectionHeader_1.sh_info;
    ElfSection::ElfSection(this_01,header_00);
    local_e8 = this_01;
    std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::push_back(&this->sections,&local_e8);
    pEStack_120 = (ElfSegment *)0x0;
    for (data_1.allocatedSize_._4_4_ = 0; iVar1 = data_1.allocatedSize_._4_4_,
        sVar5 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::size(&this->segments),
        iVar1 < (int)sVar5; data_1.allocatedSize_._4_4_ = data_1.allocatedSize_._4_4_ + 1) {
      ppEVar6 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::operator[]
                          (&this->segments,(long)data_1.allocatedSize_._4_4_);
      bVar2 = ElfSegment::isSectionPartOf(*ppEVar6,local_e8);
      if (bVar2) {
        ppEVar6 = std::vector<ElfSegment_*,_std::allocator<ElfSegment_*>_>::operator[]
                            (&this->segments,(long)data_1.allocatedSize_._4_4_);
        pEStack_120 = *ppEVar6;
        break;
      }
    }
    if (pEStack_120 == (ElfSegment *)0x0) {
      EVar3 = ElfSection::getType(local_e8);
      if ((EVar3 != 8) && (EVar3 = ElfSection::getType(local_e8), EVar3 != 0)) {
        EVar4 = ElfSection::getOffset(local_e8);
        EVar3 = ElfSection::getSize(local_e8);
        ByteArray::mid((ByteArray *)local_140,&this->fileData,(ulong)EVar4,(ulong)EVar3);
        ElfSection::setData(local_e8,(ByteArray *)local_140);
        ByteArray::~ByteArray((ByteArray *)local_140);
      }
      EVar3 = ElfSection::getType(local_e8);
      if (EVar3 == 2) {
        this->symTab = local_e8;
      }
      else if ((EVar3 == 3) &&
              ((this->strTab == (ElfSection *)0x0 || (pos_1._4_4_ != (this->fileHeader).e_shstrndx))
              )) {
        this->strTab = local_e8;
      }
      std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::push_back
                (&this->segmentlessSections,&local_e8);
    }
    else {
      ElfSegment::addSection(pEStack_120,local_e8);
    }
    pos_1._4_4_ = pos_1._4_4_ + 1;
  } while( true );
}

Assistant:

bool ElfFile::load(ByteArray& data, bool sort)
{
	fileData = data;

	loadElfHeader();
	symTab = nullptr;
	strTab = nullptr;

	// load segments
	for (size_t i = 0; i < fileHeader.e_phnum; i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		
		Elf32_Phdr sectionHeader;
		loadProgramHeader(sectionHeader, fileData, pos);

		ByteArray segmentData = fileData.mid(sectionHeader.p_offset,sectionHeader.p_filesz);
		ElfSegment* segment = new ElfSegment(sectionHeader,segmentData);
		segments.push_back(segment);
	}
	
	// load sections and assign them to segments
	for (int i = 0; i < fileHeader.e_shnum; i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;

		Elf32_Shdr sectionHeader;
		loadSectionHeader(sectionHeader, fileData, pos);

		ElfSection* section = new ElfSection(sectionHeader);
		sections.push_back(section);

		// check if the section belongs to a segment
		ElfSegment* owner = nullptr;
		for (int k = 0; k < (int)segments.size(); k++)
		{
			if (segments[k]->isSectionPartOf(section))
			{
				owner = segments[k];
				break;
			}
		}

		if (owner != nullptr)
		{
			owner->addSection(section);
		} else {
			if (section->getType() != SHT_NOBITS && section->getType() != SHT_NULL)
			{
				ByteArray data = fileData.mid(section->getOffset(),section->getSize());
				section->setData(data);
			}

			switch (section->getType())
			{
			case SHT_SYMTAB:
				symTab = section;
				break;
			case SHT_STRTAB:
				if (!strTab || i != fileHeader.e_shstrndx)
				{
					strTab = section;
				}
				break;
			}

			segmentlessSections.push_back(section);
		}
	}
	
	determinePartOrder();
	loadSectionNames();

	if (sort)
	{
		std::sort(segmentlessSections.begin(),segmentlessSections.end(),compareSection);

		for (int i = 0; i < (int)segments.size(); i++)
		{
			segments[i]->sortSections();
		}
	}

	return true;
}